

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsInputGetString
               (HelicsInput inp,char *outputString,int maxStringLen,int *actualLength,
               HelicsError *err)

{
  int iVar1;
  InputObject *pIVar2;
  
  if (actualLength != (int *)0x0) {
    *actualLength = 0;
  }
  pIVar2 = anon_unknown.dwarf_7c49a::verifyInput(inp,err);
  if (pIVar2 != (InputObject *)0x0) {
    if (err != (HelicsError *)0x0 && (0 >= maxStringLen || outputString == (char *)0x0)) {
      err->error_code = -4;
      err->message = "Output string location is invalid";
    }
    if (0 < maxStringLen && outputString != (char *)0x0) {
      iVar1 = helics::Input::getValue(pIVar2->inputPtr,outputString,maxStringLen);
      if (actualLength != (int *)0x0) {
        *actualLength = iVar1;
      }
    }
  }
  return;
}

Assistant:

void helicsInputGetString(HelicsInput inp, char* outputString, int maxStringLen, int* actualLength, HelicsError* err)
{
    if (actualLength != nullptr) {  // for initialization
        *actualLength = 0;
    }
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }

    if (!checkOutputArgString(outputString, maxStringLen, err)) {
        return;
    }
    try {
        const int length = inpObj->inputPtr->getValue(outputString, maxStringLen);
        if (actualLength != nullptr) {  // for initialization
            *actualLength = length;
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}